

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

float ImGui::ScaleRatioFromValueT<double,double,double>
                (ImGuiDataType data_type,double v,double v_min,double v_max,bool is_logarithmic,
                float logarithmic_zero_epsilon,float zero_deadzone_halfsize)

{
  undefined1 auVar1 [16];
  undefined8 uVar2;
  bool bVar3;
  double dVar4;
  double dVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 in_register_00001208 [56];
  undefined1 auVar9 [64];
  undefined1 in_register_00001248 [56];
  undefined1 auVar10 [64];
  undefined1 auVar11 [16];
  undefined1 in_register_00001288 [56];
  undefined1 auVar12 [64];
  undefined1 in_register_000012c4 [60];
  undefined1 auVar13 [64];
  double dVar14;
  double dVar15;
  float fVar16;
  double dVar17;
  undefined1 auVar18 [16];
  
  auVar13._4_60_ = in_register_000012c4;
  auVar13._0_4_ = logarithmic_zero_epsilon;
  auVar12._8_56_ = in_register_00001288;
  auVar12._0_8_ = v_max;
  auVar10._8_56_ = in_register_00001248;
  auVar10._0_8_ = v_min;
  auVar9._8_56_ = in_register_00001208;
  auVar9._0_8_ = v;
  fVar16 = 0.0;
  if ((v_min != v_max) || (NAN(v_min) || NAN(v_max))) {
    auVar6 = auVar10._0_16_;
    auVar11 = auVar12._0_16_;
    auVar1 = vminsd_avx(auVar6,auVar11);
    auVar7 = vmaxsd_avx(auVar11,auVar6);
    auVar7 = vminsd_avx(auVar7,auVar9._0_16_);
    uVar2 = vcmpsd_avx512f(auVar9._0_16_,auVar1,1);
    bVar3 = (bool)((byte)uVar2 & 1);
    dVar4 = (double)((ulong)bVar3 * auVar1._0_8_ + (ulong)!bVar3 * auVar7._0_8_);
    if (is_logarithmic) {
      auVar8 = vminsd_avx(auVar11,auVar6);
      auVar1 = vmaxsd_avx(auVar6,auVar11);
      auVar11._8_8_ = 0x7fffffffffffffff;
      auVar11._0_8_ = 0x7fffffffffffffff;
      auVar18._0_8_ = (double)logarithmic_zero_epsilon;
      auVar18._8_8_ = in_register_000012c4._4_8_;
      dVar15 = auVar8._0_8_;
      auVar7._8_4_ = 0x80000000;
      auVar7._0_8_ = 0x8000000080000000;
      auVar7._12_4_ = 0x80000000;
      auVar6 = vxorps_avx512vl(auVar13._0_16_,auVar7);
      auVar7 = vandpd_avx(auVar11,auVar1);
      dVar14 = auVar1._0_8_;
      fVar16 = auVar6._0_4_;
      uVar2 = vcmpsd_avx512f(auVar7,auVar18,1);
      bVar3 = (bool)((byte)uVar2 & 1);
      dVar5 = (double)((ulong)bVar3 *
                       (long)(double)(float)((uint)(dVar14 < 0.0) * (int)fVar16 +
                                            (uint)(dVar14 >= 0.0) * (int)logarithmic_zero_epsilon) +
                      (ulong)!bVar3 * (long)dVar14);
      if (((dVar15 != 0.0) || (NAN(dVar15))) || (0.0 <= dVar14)) {
        auVar7 = vandpd_avx(auVar11,auVar8);
        uVar2 = vcmpsd_avx512f(auVar7,auVar18,1);
        bVar3 = (bool)((byte)uVar2 & 1);
        dVar17 = (double)((ulong)bVar3 *
                          (long)(double)(float)((uint)(dVar15 < 0.0) * (int)fVar16 +
                                               (uint)(dVar15 >= 0.0) * (int)logarithmic_zero_epsilon
                                               ) + (ulong)!bVar3 * (long)dVar15);
        if (((dVar14 == 0.0) && (!NAN(dVar14))) && (dVar15 < 0.0)) {
          dVar5 = (double)fVar16;
        }
      }
      else {
        dVar17 = (double)fVar16;
      }
      fVar16 = 0.0;
      if (dVar17 < dVar4) {
        if (dVar5 <= dVar4) {
          fVar16 = 1.0;
        }
        else if (0.0 <= v_min * v_max) {
          if ((dVar15 < 0.0) || (dVar14 < 0.0)) {
            dVar4 = log(dVar4 / dVar5);
            dVar5 = log(dVar17 / dVar5);
            fVar16 = 1.0 - (float)(dVar4 / dVar5);
          }
          else {
            dVar4 = log(dVar4 / dVar17);
            dVar5 = log(dVar5 / dVar17);
            fVar16 = (float)(dVar4 / dVar5);
          }
        }
        else {
          auVar6._0_4_ = (float)dVar15;
          auVar6._4_12_ = auVar8._4_12_;
          auVar1._8_4_ = 0x80000000;
          auVar1._0_8_ = 0x8000000080000000;
          auVar1._12_4_ = 0x80000000;
          auVar7 = vxorps_avx512vl(auVar6,auVar1);
          fVar16 = auVar7._0_4_ / ((float)dVar14 - auVar6._0_4_);
          if ((v != 0.0) || (NAN(v))) {
            if (0.0 <= v) {
              dVar4 = log(dVar4 / auVar18._0_8_);
              dVar5 = log(dVar5 / auVar18._0_8_);
              auVar8._0_4_ = (float)(dVar4 / dVar5);
              auVar8._4_4_ = (int)((ulong)(dVar4 / dVar5) >> 0x20);
              auVar8._8_8_ = 0;
              auVar7 = vfmadd213ss_fma(ZEXT416((uint)(1.0 - (fVar16 + zero_deadzone_halfsize))),
                                       auVar8,ZEXT416((uint)(fVar16 + zero_deadzone_halfsize)));
              fVar16 = auVar7._0_4_;
            }
            else {
              dVar4 = log(-dVar4 / auVar18._0_8_);
              dVar5 = log(-dVar17 / auVar18._0_8_);
              fVar16 = (1.0 - (float)(dVar4 / dVar5)) * (fVar16 - zero_deadzone_halfsize);
            }
          }
        }
      }
      fVar16 = (float)((uint)(v_max < v_min) * (int)(1.0 - fVar16) +
                      (uint)(v_max >= v_min) * (int)fVar16);
    }
    else {
      fVar16 = (float)((dVar4 - v_min) / (v_max - v_min));
    }
  }
  return fVar16;
}

Assistant:

float ImGui::ScaleRatioFromValueT(ImGuiDataType data_type, TYPE v, TYPE v_min, TYPE v_max, bool is_logarithmic, float logarithmic_zero_epsilon, float zero_deadzone_halfsize)
{
    if (v_min == v_max)
        return 0.0f;
    IM_UNUSED(data_type);

    const TYPE v_clamped = (v_min < v_max) ? ImClamp(v, v_min, v_max) : ImClamp(v, v_max, v_min);
    if (is_logarithmic)
    {
        bool flipped = v_max < v_min;

        if (flipped) // Handle the case where the range is backwards
            ImSwap(v_min, v_max);

        // Fudge min/max to avoid getting close to log(0)
        FLOATTYPE v_min_fudged = (ImAbs((FLOATTYPE)v_min) < logarithmic_zero_epsilon) ? ((v_min < 0.0f) ? -logarithmic_zero_epsilon : logarithmic_zero_epsilon) : (FLOATTYPE)v_min;
        FLOATTYPE v_max_fudged = (ImAbs((FLOATTYPE)v_max) < logarithmic_zero_epsilon) ? ((v_max < 0.0f) ? -logarithmic_zero_epsilon : logarithmic_zero_epsilon) : (FLOATTYPE)v_max;

        // Awkward special cases - we need ranges of the form (-100 .. 0) to convert to (-100 .. -epsilon), not (-100 .. epsilon)
        if ((v_min == 0.0f) && (v_max < 0.0f))
            v_min_fudged = -logarithmic_zero_epsilon;
        else if ((v_max == 0.0f) && (v_min < 0.0f))
            v_max_fudged = -logarithmic_zero_epsilon;

        float result;

        if (v_clamped <= v_min_fudged)
            result = 0.0f; // Workaround for values that are in-range but below our fudge
        else if (v_clamped >= v_max_fudged)
            result = 1.0f; // Workaround for values that are in-range but above our fudge
        else if ((v_min * v_max) < 0.0f) // Range crosses zero, so split into two portions
        {
            float zero_point_center = (-(float)v_min) / ((float)v_max - (float)v_min); // The zero point in parametric space.  There's an argument we should take the logarithmic nature into account when calculating this, but for now this should do (and the most common case of a symmetrical range works fine)
            float zero_point_snap_L = zero_point_center - zero_deadzone_halfsize;
            float zero_point_snap_R = zero_point_center + zero_deadzone_halfsize;
            if (v == 0.0f)
                result = zero_point_center; // Special case for exactly zero
            else if (v < 0.0f)
                result = (1.0f - (float)(ImLog(-(FLOATTYPE)v_clamped / logarithmic_zero_epsilon) / ImLog(-v_min_fudged / logarithmic_zero_epsilon))) * zero_point_snap_L;
            else
                result = zero_point_snap_R + ((float)(ImLog((FLOATTYPE)v_clamped / logarithmic_zero_epsilon) / ImLog(v_max_fudged / logarithmic_zero_epsilon)) * (1.0f - zero_point_snap_R));
        }
        else if ((v_min < 0.0f) || (v_max < 0.0f)) // Entirely negative slider
            result = 1.0f - (float)(ImLog(-(FLOATTYPE)v_clamped / -v_max_fudged) / ImLog(-v_min_fudged / -v_max_fudged));
        else
            result = (float)(ImLog((FLOATTYPE)v_clamped / v_min_fudged) / ImLog(v_max_fudged / v_min_fudged));

        return flipped ? (1.0f - result) : result;
    }

    // Linear slider
    return (float)((FLOATTYPE)(SIGNEDTYPE)(v_clamped - v_min) / (FLOATTYPE)(SIGNEDTYPE)(v_max - v_min));
}